

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.h
# Opt level: O0

CornerIndex __thiscall
draco::MeshAttributeCornerTable::SwingLeft(MeshAttributeCornerTable *this,CornerIndex corner)

{
  CornerIndex CVar1;
  MeshAttributeCornerTable *in_RDI;
  CornerIndex in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffec;
  MeshAttributeCornerTable *pMVar2;
  
  pMVar2 = in_RDI;
  CVar1 = Next(in_RDI,in_stack_ffffffffffffffe0);
  Opposite((MeshAttributeCornerTable *)CONCAT44(in_stack_ffffffffffffffec,CVar1.value_),
           (CornerIndex)(uint)pMVar2);
  CVar1 = Next(in_RDI,in_stack_ffffffffffffffe0);
  return (CornerIndex)CVar1.value_;
}

Assistant:

inline CornerIndex SwingLeft(CornerIndex corner) const {
    return Next(Opposite(Next(corner)));
  }